

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigManager.cpp
# Opt level: O2

ChannelController *
anon_unknown.dwarf_3aaf71::make_basic_channel_controller
          (char *name,config_map_t *initial_cfg,Options *opts)

{
  bool bVar1;
  ChannelController *this;
  config_map_t *pcVar2;
  mapped_type *pmVar3;
  info_map_t *metadata;
  allocator<char> local_61;
  key_type local_60;
  string output;
  
  this = (ChannelController *)operator_new(0x18);
  cali::ChannelController::ChannelController(this,name,0,initial_cfg);
  this->_vptr_ChannelController = (_func_int **)&PTR_on_create_00290858;
  bVar1 = cali::ConfigManager::Options::is_set(opts,"output");
  if (bVar1) {
    cali::ConfigManager::Options::get_abi_cxx11_(&output,opts,"output","");
    pcVar2 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CALI_RECORDER_FILENAME",&local_61);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_60);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_60);
    pcVar2 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CALI_REPORT_FILENAME",&local_61);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_60);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_60);
    pcVar2 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CALI_MPIREPORT_FILENAME",&local_61);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_60);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&output);
  }
  pcVar2 = cali::ChannelController::config_abi_cxx11_(this);
  cali::ConfigManager::Options::update_channel_config(opts,pcVar2);
  metadata = cali::ChannelController::metadata_abi_cxx11_(this);
  cali::ConfigManager::Options::update_channel_metadata(opts,metadata);
  return this;
}

Assistant:

ChannelController* make_basic_channel_controller(
    const char*                   name,
    const config_map_t&           initial_cfg,
    const ConfigManager::Options& opts
)
{
    class BasicController : public ChannelController
    {
    public:

        BasicController(const char* name, const config_map_t& initial_cfg, const ConfigManager::Options& opts)
            : ChannelController(name, 0, initial_cfg)
        {
            // Hacky way to handle "output" option
            if (opts.is_set("output")) {
                std::string output = opts.get("output");

                config()["CALI_RECORDER_FILENAME"]  = output;
                config()["CALI_REPORT_FILENAME"]    = output;
                config()["CALI_MPIREPORT_FILENAME"] = output;
            }

            opts.update_channel_config(config());
            opts.update_channel_metadata(metadata());
        }
    };

    return new BasicController(name, initial_cfg, opts);
}